

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,Function *func,bool decl)

{
  uint uVar1;
  String *pSVar2;
  FunctionType *this_00;
  Type *type;
  IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
  IVar3;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var4;
  undefined7 in_register_00000011;
  uint index;
  Type *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) != 0) {
    local_30 = Value::getType((Value *)func);
    pSVar2 = Function::getName_abi_cxx11_(func);
    append<char_const(&)[8],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [8])"define ",&local_30,(char (*) [3])" @",pSVar2,
               (char (*) [2])0x1a77ab);
    this_00 = Function::getFunctionType(func);
    index = 0;
    while( true ) {
      uVar1 = FunctionType::getNumParams(this_00);
      if (uVar1 <= index) break;
      type = FunctionType::getParamType(this_00,index);
      append(this,type);
      index = index + 1;
      uVar1 = FunctionType::getNumParams(this_00);
      if (index < uVar1) {
        std::operator<<((ostream *)this,", ");
      }
    }
    std::operator<<((ostream *)this,")");
    IVar3 = Function::begin(func);
    _Var4._M_current = (BasicBlock **)Function::end(func);
    if (IVar3.iter._M_current !=
        (__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
         )_Var4._M_current) {
      begin_scope(this);
      _Var4._M_current = (BasicBlock **)Function::begin(func);
      IVar3 = Function::end(func);
      for (; (__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
              )_Var4._M_current != IVar3.iter._M_current; _Var4._M_current = _Var4._M_current + 1) {
        append(this,*_Var4._M_current,true);
      }
      end_scope(this);
    }
    return;
  }
  pSVar2 = Function::getName_abi_cxx11_(func);
  append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&>
            (this,(char (*) [2])0x1a78d7,pSVar2);
  return;
}

Assistant:

void StreamState::append(Function *func, bool decl)
{
	if (decl)
	{
		append("define ", func->getType(), " @", func->getName(), "(");
		auto *type = func->getFunctionType();
		for (unsigned i = 0; i < type->getNumParams(); i++)
		{
			append(type->getParamType(i));
			if (i + 1 < type->getNumParams())
				append(", ");
		}
		append(")");

		if (func->begin() != func->end())
		{
			begin_scope();
			for (auto &bb : *func)
				append(&bb, true);
			end_scope();
		}
	}
	else
		append("@", func->getName());
}